

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O1

void __thiscall QLineEdit::mouseMoveEvent(QLineEdit *this,QMouseEvent *e)

{
  QLineEditPrivate *this_00;
  ulong uVar1;
  bool bVar2;
  LayoutDirection LVar3;
  QWidgetLineControl *this_01;
  int iVar4;
  int iVar7;
  double dVar5;
  undefined1 auVar6 [16];
  int iVar8;
  int iVar10;
  double extraout_XMM1_Qa;
  double dVar9;
  double extraout_XMM1_Qa_00;
  undefined1 auVar11 [16];
  
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  if (((byte)e[0x44] & 1) == 0) goto LAB_00421741;
  if ((this_00->dndTimer).m_id != Invalid) {
    auVar11 = QEventPoint::position();
    auVar6._0_8_ = (double)((ulong)auVar11._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar11._0_8_;
    auVar6._8_8_ = (double)((ulong)auVar11._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                   auVar11._8_8_;
    auVar6 = minpd(_DAT_0066f5d0,auVar6);
    auVar6 = maxpd(auVar6,_DAT_0066f5e0);
    iVar8 = (this_00->mousePressPos).xp.m_i - (int)auVar6._0_8_;
    iVar10 = (this_00->mousePressPos).yp.m_i - (int)auVar6._8_8_;
    iVar4 = iVar8 >> 0x1f;
    iVar7 = iVar10 >> 0x1f;
    uVar1 = CONCAT44(iVar10,iVar8) ^ CONCAT44(iVar7,iVar4);
    iVar8 = QApplication::startDragDistance();
    if (iVar8 < ((int)(uVar1 >> 0x20) - iVar7) + ((int)uVar1 - iVar4)) {
      QLineEditPrivate::drag(this_00);
    }
    goto LAB_00421741;
  }
  if (this_00->mouseYThreshold < 1) {
LAB_004215fd:
    if (0 < this_00->mouseYThreshold) {
      QEventPoint::position();
      dVar5 = (double)((ulong)extraout_XMM1_Qa_00 & 0x8000000000000000 | (ulong)DAT_0066f5c0) +
              extraout_XMM1_Qa_00;
      dVar9 = 2147483647.0;
      if (dVar5 <= 2147483647.0) {
        dVar9 = dVar5;
      }
      if (dVar9 <= -2147483648.0) {
        dVar9 = -2147483648.0;
      }
      if ((int)dVar9 + this_00->mouseYThreshold < (this_00->mousePressPos).yp.m_i) {
        LVar3 = QWidget::layoutDirection(&this->super_QWidget);
        this_01 = this_00->control;
        if (LVar3 == RightToLeft) goto LAB_00421664;
        goto LAB_004215f6;
      }
    }
    bVar2 = QWidgetLineControl::composeMode((QWidgetLineControl *)this_00->control);
    if (bVar2) {
      iVar8 = QLineEditPrivate::xToPos
                        (this_00,(this_00->mousePressPos).xp.m_i,CursorBetweenCharacters);
      dVar5 = (double)QEventPoint::position();
      dVar5 = (double)((ulong)dVar5 & 0x8000000000000000 | (ulong)DAT_0066f5c0) + dVar5;
      dVar9 = 2147483647.0;
      if (dVar5 <= 2147483647.0) {
        dVar9 = dVar5;
      }
      if (dVar9 <= -2147483648.0) {
        dVar9 = -2147483648.0;
      }
      iVar4 = QLineEditPrivate::xToPos(this_00,(int)dVar9,CursorBetweenCharacters);
      if (iVar4 - iVar8 != 0) {
        QWidgetLineControl::setSelection((QWidgetLineControl *)this_00->control,iVar8,iVar4 - iVar8)
        ;
      }
      goto LAB_00421741;
    }
    this_01 = this_00->control;
    dVar5 = (double)QEventPoint::position();
    dVar5 = (double)((ulong)dVar5 & 0x8000000000000000 | (ulong)DAT_0066f5c0) + dVar5;
    dVar9 = 2147483647.0;
    if (dVar5 <= 2147483647.0) {
      dVar9 = dVar5;
    }
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    iVar8 = QLineEditPrivate::xToPos(this_00,(int)dVar9,CursorBetweenCharacters);
  }
  else {
    QEventPoint::position();
    dVar5 = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | (ulong)DAT_0066f5c0) +
            extraout_XMM1_Qa;
    dVar9 = 2147483647.0;
    if (dVar5 <= 2147483647.0) {
      dVar9 = dVar5;
    }
    if (dVar9 <= -2147483648.0) {
      dVar9 = -2147483648.0;
    }
    if ((int)dVar9 <= this_00->mouseYThreshold + (this_00->mousePressPos).yp.m_i) goto LAB_004215fd;
    LVar3 = QWidget::layoutDirection(&this->super_QWidget);
    this_01 = this_00->control;
    if (LVar3 == RightToLeft) {
LAB_004215f6:
      iVar8 = 0;
    }
    else {
LAB_00421664:
      iVar8 = (int)(this_01->m_text).d.size;
    }
  }
  QWidgetLineControl::moveCursor((QWidgetLineControl *)this_01,iVar8,true);
LAB_00421741:
  QLineEditPrivate::sendMouseEventToInputContext(this_00,e);
  return;
}

Assistant:

void QLineEdit::mouseMoveEvent(QMouseEvent * e)
{
    Q_D(QLineEdit);

    if (e->buttons() & Qt::LeftButton) {
#if QT_CONFIG(draganddrop)
        if (d->dndTimer.isActive()) {
            if ((d->mousePressPos - e->position().toPoint()).manhattanLength() > QApplication::startDragDistance())
                d->drag();
        } else
#endif
        {
#ifndef Q_OS_ANDROID
            const bool select = true;
#else
            const bool select = (d->imHints & Qt::ImhNoPredictiveText);
#endif
#ifndef QT_NO_IM
            if (d->mouseYThreshold > 0 && e->position().toPoint().y() > d->mousePressPos.y() + d->mouseYThreshold) {
                if (layoutDirection() == Qt::RightToLeft)
                    d->control->home(select);
                else
                    d->control->end(select);
            } else if (d->mouseYThreshold > 0 && e->position().toPoint().y() + d->mouseYThreshold < d->mousePressPos.y()) {
                if (layoutDirection() == Qt::RightToLeft)
                    d->control->end(select);
                else
                    d->control->home(select);
            } else if (d->control->composeMode() && select) {
                int startPos = d->xToPos(d->mousePressPos.x());
                int currentPos = d->xToPos(e->position().toPoint().x());
                if (startPos != currentPos)
                    d->control->setSelection(startPos, currentPos - startPos);

            } else
#endif
            {
                d->control->moveCursor(d->xToPos(e->position().toPoint().x()), select);
            }
        }
    }

    d->sendMouseEventToInputContext(e);
}